

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MultipleBindingCase::renderTo
          (MultipleBindingCase *this,Surface *dst)

{
  int iVar1;
  deUint32 dVar2;
  int height;
  GLenum GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *log;
  GLuint local_e4;
  int local_e0;
  PixelBufferAccess local_90;
  uint local_64;
  GLuint local_60;
  int divisor;
  GLuint buffer;
  int offset;
  int stride;
  int colorOffsetBinding;
  int positionBinding;
  int offsetLoc;
  int colorLoc;
  GLuint local_34;
  undefined1 local_30 [4];
  int positionLoc;
  CallLogWrapper gl;
  Surface *dst_local;
  MultipleBindingCase *this_local;
  
  gl._16_8_ = dst;
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_BindingRenderCase).super_TestCase.m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  log = tcu::TestContext::getLog
                  ((this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)local_30,(Functions *)CONCAT44(extraout_var,iVar1),log);
  dVar2 = glu::ShaderProgram::getProgram((this->super_BindingRenderCase).m_program);
  local_34 = glu::CallLogWrapper::glGetAttribLocation((CallLogWrapper *)local_30,dVar2,"a_position")
  ;
  dVar2 = glu::ShaderProgram::getProgram((this->super_BindingRenderCase).m_program);
  positionBinding =
       glu::CallLogWrapper::glGetAttribLocation((CallLogWrapper *)local_30,dVar2,"a_color");
  dVar2 = glu::ShaderProgram::getProgram((this->super_BindingRenderCase).m_program);
  colorOffsetBinding =
       glu::CallLogWrapper::glGetAttribLocation((CallLogWrapper *)local_30,dVar2,"a_offset");
  stride = 1;
  offset = 2;
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)local_30,true);
  glu::CallLogWrapper::glClearColor((CallLogWrapper *)local_30,0.0,0.0,0.0,0.0);
  glu::CallLogWrapper::glClear((CallLogWrapper *)local_30,0x4000);
  iVar1 = tcu::Surface::getWidth((Surface *)gl._16_8_);
  height = tcu::Surface::getHeight((Surface *)gl._16_8_);
  glu::CallLogWrapper::glViewport((CallLogWrapper *)local_30,0,0,iVar1,height);
  glu::CallLogWrapper::glBindVertexArray
            ((CallLogWrapper *)local_30,(this->super_BindingRenderCase).m_vao);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_30);
  glu::checkError(GVar3,"set vao",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x276);
  dVar2 = glu::ShaderProgram::getProgram((this->super_BindingRenderCase).m_program);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)local_30,dVar2);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_30);
  glu::checkError(GVar3,"use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x279);
  glu::CallLogWrapper::glEnableVertexAttribArray((CallLogWrapper *)local_30,local_34);
  glu::CallLogWrapper::glEnableVertexAttribArray((CallLogWrapper *)local_30,positionBinding);
  glu::CallLogWrapper::glEnableVertexAttribArray((CallLogWrapper *)local_30,colorOffsetBinding);
  glu::CallLogWrapper::glVertexAttribFormat((CallLogWrapper *)local_30,local_34,4,0x1406,'\0',0);
  glu::CallLogWrapper::glVertexAttribFormat
            ((CallLogWrapper *)local_30,positionBinding,4,0x1406,'\0',0);
  glu::CallLogWrapper::glVertexAttribFormat
            ((CallLogWrapper *)local_30,colorOffsetBinding,4,0x1406,'\0',0x10);
  glu::CallLogWrapper::glVertexAttribBinding((CallLogWrapper *)local_30,local_34,1);
  glu::CallLogWrapper::glVertexAttribBinding((CallLogWrapper *)local_30,positionBinding,2);
  glu::CallLogWrapper::glVertexAttribBinding((CallLogWrapper *)local_30,colorOffsetBinding,2);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_30);
  glu::checkError(GVar3,"setup attribs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x289);
  glu::CallLogWrapper::glVertexBindingDivisor((CallLogWrapper *)local_30,1,0);
  glu::CallLogWrapper::glBindVertexBuffer((CallLogWrapper *)local_30,1,this->m_primitiveBuf,0,0x10);
  buffer = 0x20;
  if (((this->m_spec).zeroStride & 1U) != 0) {
    buffer = 0;
  }
  if (((this->m_spec).aliasingBuffers & 1U) == 0) {
    local_e0 = 0;
  }
  else {
    local_e0 = 0x9600;
    if (((this->m_spec).instanced & 1U) != 0) {
      local_e0 = 0x60;
    }
  }
  divisor = local_e0;
  if (((this->m_spec).aliasingBuffers & 1U) == 0) {
    local_e4 = this->m_colorOffsetBuf;
  }
  else {
    local_e4 = this->m_primitiveBuf;
  }
  local_60 = local_e4;
  local_64 = (this->m_spec).instanced & 1;
  glu::CallLogWrapper::glVertexBindingDivisor((CallLogWrapper *)local_30,2,local_64);
  glu::CallLogWrapper::glBindVertexBuffer
            ((CallLogWrapper *)local_30,2,local_60,(long)divisor,buffer);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_30);
  glu::checkError(GVar3,"set binding points",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x29a);
  if (((this->m_spec).instanced & 1U) == 0) {
    glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)local_30,4,0,0x960);
  }
  else {
    glu::CallLogWrapper::glDrawArraysInstanced((CallLogWrapper *)local_30,4,0,6,400);
  }
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_30);
  glu::checkError(GVar3,"draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x2a0);
  glu::CallLogWrapper::glFinish((CallLogWrapper *)local_30);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)local_30,0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)local_30,0);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_30);
  glu::checkError(GVar3,"clean",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x2a5);
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_BindingRenderCase).super_TestCase.m_context);
  tcu::Surface::getAccess(&local_90,(Surface *)gl._16_8_);
  glu::readPixels(pRVar4,0,0,&local_90);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_30);
  return;
}

Assistant:

void MultipleBindingCase::renderTo (tcu::Surface& dst)
{
	glu::CallLogWrapper gl					(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	const int			positionLoc			= gl.glGetAttribLocation(m_program->getProgram(), "a_position");
	const int			colorLoc			= gl.glGetAttribLocation(m_program->getProgram(), "a_color");
	const int			offsetLoc			= gl.glGetAttribLocation(m_program->getProgram(), "a_offset");

	const int			positionBinding		= 1;
	const int			colorOffsetBinding	= 2;

	gl.enableLogging(true);

	gl.glClearColor(0.0f, 0.0f, 0.0f, 0.0f);
	gl.glClear(GL_COLOR_BUFFER_BIT);
	gl.glViewport(0, 0, dst.getWidth(), dst.getHeight());
	gl.glBindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "set vao");

	gl.glUseProgram(m_program->getProgram());
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "use program");

	// Setup format & binding

	gl.glEnableVertexAttribArray(positionLoc);
	gl.glEnableVertexAttribArray(colorLoc);
	gl.glEnableVertexAttribArray(offsetLoc);

	gl.glVertexAttribFormat(positionLoc, 4, GL_FLOAT, GL_FALSE, 0);
	gl.glVertexAttribFormat(colorLoc, 4, GL_FLOAT, GL_FALSE, 0);
	gl.glVertexAttribFormat(offsetLoc, 4, GL_FLOAT, GL_FALSE, sizeof(tcu::Vec4));

	gl.glVertexAttribBinding(positionLoc, positionBinding);
	gl.glVertexAttribBinding(colorLoc, colorOffsetBinding);
	gl.glVertexAttribBinding(offsetLoc, colorOffsetBinding);

	GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup attribs");

	// setup binding points

	gl.glVertexBindingDivisor(positionBinding, 0);
	gl.glBindVertexBuffer(positionBinding, m_primitiveBuf, 0, sizeof(tcu::Vec4));

	{
		const int			stride	= (m_spec.zeroStride) ? (0) : (2 * (int)sizeof(tcu::Vec4));
		const int			offset	= (!m_spec.aliasingBuffers) ? (0) : (m_spec.instanced) ? (6 * (int)sizeof(tcu::Vec4)) : (6 * GRID_SIZE * GRID_SIZE * (int)sizeof(tcu::Vec4));
		const glw::GLuint	buffer	= (m_spec.aliasingBuffers) ? (m_primitiveBuf) : (m_colorOffsetBuf);
		const int			divisor	= (m_spec.instanced) ? (1) : (0);

		gl.glVertexBindingDivisor(colorOffsetBinding, divisor);
		gl.glBindVertexBuffer(colorOffsetBinding, buffer, offset, (glw::GLsizei)stride);
	}

	GLU_EXPECT_NO_ERROR(gl.glGetError(), "set binding points");

	if (m_spec.instanced)
		gl.glDrawArraysInstanced(GL_TRIANGLES, 0, 6, GRID_SIZE*GRID_SIZE);
	else
		gl.glDrawArrays(GL_TRIANGLES, 0, GRID_SIZE*GRID_SIZE*6);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "draw");

	gl.glFinish();
	gl.glBindVertexArray(0);
	gl.glUseProgram(0);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "clean");

	glu::readPixels(m_context.getRenderContext(), 0, 0, dst.getAccess());
}